

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O0

mkv_timestamp_t MATROSKA_BlockGetFrameStart(matroska_block *Block,size_t FrameNum)

{
  matroska_block *local_30;
  mkv_timestamp_t Start;
  size_t i;
  size_t FrameNum_local;
  matroska_block *Block_local;
  
  if (Block == (matroska_block *)0xffffffffffffff48) {
    __assert_fail("&(Block->Durations)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                  ,0x146,
                  "mkv_timestamp_t MATROSKA_BlockGetFrameStart(const matroska_block *, size_t)");
  }
  if (FrameNum < (Block->Durations)._Used >> 3) {
    local_30 = (matroska_block *)MATROSKA_BlockTimestamp(Block);
    if (local_30 != (matroska_block *)0x7fffffffffffffff) {
      for (Start = 0; (ulong)Start < FrameNum; Start = Start + 1) {
        if (Block == (matroska_block *)0xffffffffffffff48) {
          __assert_fail("&(Block->Durations)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                        ,0x150,
                        "mkv_timestamp_t MATROSKA_BlockGetFrameStart(const matroska_block *, size_t)"
                       );
        }
        if (*(long *)((Block->Durations)._Begin + Start * 8) == 0x7fffffffffffffff) {
          return (mkv_timestamp_t)(matroska_block *)0x7fffffffffffffff;
        }
        if (Block == (matroska_block *)0xffffffffffffff48) {
          __assert_fail("&(Block->Durations)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                        ,0x152,
                        "mkv_timestamp_t MATROSKA_BlockGetFrameStart(const matroska_block *, size_t)"
                       );
        }
        local_30 = (matroska_block *)
                   ((long)&(local_30->Base).Base.Base.Base.FourCC +
                   *(long *)((Block->Durations)._Begin + Start * 8));
      }
    }
    Block_local = local_30;
  }
  else {
    Block_local = (matroska_block *)0x7fffffffffffffff;
  }
  return (mkv_timestamp_t)Block_local;
}

Assistant:

mkv_timestamp_t MATROSKA_BlockGetFrameStart(const matroska_block *Block, size_t FrameNum)
{
    if (FrameNum >= ARRAYCOUNT(Block->Durations,mkv_timestamp_t))
        return INVALID_TIMESTAMP_T;
    else
    {
        size_t i;
        mkv_timestamp_t Start = MATROSKA_BlockTimestamp((matroska_block*)Block);
        if (Start!=INVALID_TIMESTAMP_T)
        {
            for (i=0;i<FrameNum;++i)
            {
                if (ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i]==INVALID_TIMESTAMP_T)
                    return INVALID_TIMESTAMP_T;
                Start += ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i];
            }
        }
        return Start;
    }
}